

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_load_fpr64(DisasContext_conflict6 *ctx,TCGv_i64 t,int reg)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGContext_conflict6 *tcg_ctx;
  int reg_local;
  TCGv_i64 t_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->hflags & 0x40) == 0) {
    tcg_gen_concat32_i64
              (tcg_ctx_00,t,tcg_ctx_00->fpu_f64[(int)(reg & 0xfffffffe)],
               tcg_ctx_00->fpu_f64[(int)(reg | 1)]);
  }
  else {
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,t,tcg_ctx_00->fpu_f64[reg]);
  }
  return;
}

Assistant:

static void gen_load_fpr64(DisasContext *ctx, TCGv_i64 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_F64) {
        tcg_gen_mov_i64(tcg_ctx, t, tcg_ctx->fpu_f64[reg]);
    } else {
        tcg_gen_concat32_i64(tcg_ctx, t, tcg_ctx->fpu_f64[reg & ~1], tcg_ctx->fpu_f64[reg | 1]);
    }
}